

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_detect.c
# Opt level: O0

void av1_invalidate_corner_list(CornerList *corners)

{
  pthread_mutex_t *in_RDI;
  
  if (in_RDI != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock(in_RDI);
    in_RDI[1].__size[0] = '\0';
    pthread_mutex_unlock(in_RDI);
  }
  return;
}

Assistant:

void av1_invalidate_corner_list(CornerList *corners) {
  if (corners) {
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(&corners->mutex);
#endif  // CONFIG_MULTITHREAD
    corners->valid = false;
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(&corners->mutex);
#endif  // CONFIG_MULTITHREAD
  }
}